

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::Delaunay3d::show_list(Delaunay3d *this,index_t first,string *list_name)

{
  ostream *poVar1;
  index_t local_24;
  index_t t;
  string *list_name_local;
  index_t first_local;
  Delaunay3d *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"tet list: ");
  poVar1 = std::operator<<(poVar1,(string *)list_name);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_24 = first; local_24 != 0x7fffffff; local_24 = tet_next(this,local_24)) {
    show_tet(this,local_24);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"-------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Delaunay3d::show_list(
        index_t first, const std::string& list_name
    ) const {
        index_t t = first;
        std::cerr << "tet list: " << list_name << std::endl;
        while(t != END_OF_LIST) {
            show_tet(t);
            t = tet_next(t);
        }
        std::cerr << "-------------" << std::endl;
    }